

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O0

void __thiscall dpfb::Image::Image(Image *this,int w,int h)

{
  runtime_error *prVar1;
  uchar *puVar2;
  int h_local;
  int w_local;
  Image *this_local;
  
  this->w = w;
  this->h = h;
  this->pitch = w;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&this->ownData);
  if (w < 0) {
    prVar1 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar1,"Width is < 0");
    __cxa_throw(prVar1,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (h < 0) {
    prVar1 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar1,"Height is < 0");
    __cxa_throw(prVar1,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&this->ownData,(long)w * (long)h);
  puVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(&this->ownData);
  this->data = puVar2;
  return;
}

Assistant:

Image::Image(int w, int h)
    : w {w}
    , h {h}
    , pitch {w}
{
    if (w < 0)
        throw std::runtime_error("Width is < 0");
    if (h < 0)
        throw std::runtime_error("Height is < 0");

    ownData.resize(static_cast<std::size_t>(w) * h);
    data = ownData.data();

}